

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::GenerateFastObjectIsIn(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  RegOpnd *baseOpnd;
  RegOpnd *srcReg;
  LabelInstr *labelDone;
  undefined4 *puVar5;
  Lowerer *this_00;
  Opnd *dest;
  uint32 inlineCacheOffset;
  uint32 hitRateOffset;
  LabelInstr *labelHelper;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3a;
  LabelInstr *local_38;
  
  this_00 = this;
  baseOpnd = GetRegOpnd(this,instr->m_src2,instr,this->m_func,TyVar);
  srcReg = GetRegOpnd(this_00,instr->m_src1,instr,this->m_func,TyVar);
  local_3e = (srcReg->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsLikelyString((ValueType *)&local_3e.field_0);
  local_3c = (srcReg->super_Opnd).m_valueType.field_0;
  bVar3 = ValueType::IsLikelySymbol((ValueType *)&local_3c.field_0);
  local_3a = (baseOpnd->super_Opnd).m_valueType.field_0;
  bVar4 = ValueType::IsLikelyObject((ValueType *)&local_3a.field_0);
  if ((bVar4) && (bVar2 || bVar3)) {
    local_38 = IR::LabelInstr::New(Label,this->m_func,true);
    labelDone = IR::LabelInstr::New(Label,this->m_func,false);
    labelHelper = local_38;
    if (bVar2) {
      GeneratePropertyStringTest(this,srcReg,instr,local_38,false);
      dest = instr->m_dst;
      inlineCacheOffset = 0x28;
      hitRateOffset = 0x38;
    }
    else {
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x51eb,"(likelySymbolIndex)","likelySymbolIndex");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      labelHelper = local_38;
      GenerateSymbolTest(this,srcReg,instr,local_38,(LabelInstr *)0x0,true);
      dest = instr->m_dst;
      inlineCacheOffset = 0x18;
      hitRateOffset = 0x28;
    }
    GenerateFastIsInSymbolOrStringIndex
              (this,instr,srcReg,baseOpnd,dest,inlineCacheOffset,hitRateOffset,labelHelper,labelDone
              );
    IR::Instr::InsertBefore(instr,&local_38->super_Instr);
    IR::Instr::InsertAfter(instr,&labelDone->super_Instr);
  }
  return;
}

Assistant:

void Lowerer::GenerateFastObjectIsIn(IR::Instr * instr)
{
    IR::RegOpnd* baseOpnd = GetRegOpnd(instr->GetSrc2(), instr, m_func, TyVar);
    IR::RegOpnd* indexOpnd = GetRegOpnd(instr->GetSrc1(), instr, m_func, TyVar);
    bool likelyStringIndex = indexOpnd->GetValueType().IsLikelyString();
    bool likelySymbolIndex = indexOpnd->GetValueType().IsLikelySymbol();

    if (!baseOpnd->GetValueType().IsLikelyObject() || !(likelyStringIndex || likelySymbolIndex))
    {
        return;
    }

    IR::LabelInstr* helperLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
    IR::LabelInstr* doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    if (likelyStringIndex)
    {
        GeneratePropertyStringTest(indexOpnd, instr, helperLabel, false /*isStore*/);

        const uint32 inlineCacheOffset = Js::PropertyString::GetOffsetOfLdElemInlineCache();
        const uint32 hitRateOffset = Js::PropertyString::GetOffsetOfHitRate();

        GenerateFastIsInSymbolOrStringIndex(instr, indexOpnd, baseOpnd, instr->GetDst(), inlineCacheOffset, hitRateOffset, helperLabel, doneLabel);
    }
    else
    {
        Assert(likelySymbolIndex);

        GenerateSymbolTest(indexOpnd, instr, helperLabel);

        const uint32 inlineCacheOffset = Js::JavascriptSymbol::GetOffsetOfLdElemInlineCache();
        const uint32 hitRateOffset = Js::JavascriptSymbol::GetOffsetOfHitRate();

        GenerateFastIsInSymbolOrStringIndex(instr, indexOpnd, baseOpnd, instr->GetDst(), inlineCacheOffset, hitRateOffset, helperLabel, doneLabel);
    }

    instr->InsertBefore(helperLabel);
    instr->InsertAfter(doneLabel);
}